

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall
TPZFrontSym<std::complex<double>_>::AddKel
          (TPZFrontSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  complex<double> *pcVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  lVar3 = sourceindex->fNElements;
  if (0 < lVar3) {
    lVar15 = 0;
    do {
      iVar10 = Local(this,destinationindex->fStore[lVar15]);
      lVar13 = (long)iVar10;
      lVar16 = lVar15;
      do {
        iVar10 = Local(this,destinationindex->fStore[lVar16]);
        lVar4 = sourceindex->fStore[lVar15];
        lVar5 = sourceindex->fStore[lVar16];
        lVar6 = (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        if (((lVar4 < 0 || lVar6 <= lVar4) || (lVar5 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar11 = (long)iVar10;
        lVar14 = lVar11;
        if (lVar11 < lVar13) {
          lVar14 = lVar13;
        }
        if (lVar13 < lVar11) {
          lVar11 = lVar13;
        }
        lVar14 = (lVar14 + 1) * lVar14;
        uVar12 = lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffe;
        pcVar7 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
        dVar8 = *(double *)(elmat->fElem[lVar6 * lVar5 + lVar4]._M_value + 8);
        pdVar1 = (double *)(pcVar7[lVar11]._M_value + uVar12 * 8);
        dVar9 = pdVar1[1];
        pdVar2 = (double *)(pcVar7[lVar11]._M_value + uVar12 * 8);
        *pdVar2 = *pdVar1 + *(double *)elmat->fElem[lVar6 * lVar5 + lVar4]._M_value;
        pdVar2[1] = dVar9 + dVar8;
        lVar16 = lVar16 + 1;
      } while (lVar16 < lVar3);
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar3);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = i; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}